

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

bool __thiscall
helics::LogManager::sendToLogger
          (LogManager *this,int logLevel,string_view header,string_view message,bool fromRemote)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view str;
  string_view message_00;
  format_string_t<std::basic_string_view<char>_&> fmt;
  format_string_t<std::basic_string_view<char>_&,_std::basic_string_view<char>_&> fmt_00;
  format_string_t<std::basic_string_view<char>_&> fmt_01;
  format_string_t<std::basic_string_view<char>_&,_std::basic_string_view<char>_&> fmt_02;
  string_view header_00;
  bool bVar1;
  action_t aVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  action_t in_ESI;
  ActionMessage *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte in_stack_00000008;
  ActionMessage remMess;
  pair<helics::GlobalFederateId,_int> *rl;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
  *__range2;
  bool alwaysLog;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  ActionMessage *in_stack_fffffffffffffe20;
  element_type *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  action_t startingAction;
  SmallBuffer *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  level_enum lvl;
  logger *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  char local_130 [16];
  BaseType local_120;
  reference local_78;
  pair<helics::GlobalFederateId,_int> *local_70;
  __normal_iterator<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
  local_68;
  Time *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  byte local_36;
  byte local_35;
  action_t local_34;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  bool local_1;
  
  local_35 = in_stack_00000008 & 1;
  local_36 = local_35;
  local_34 = in_ESI;
  if (0x1863b < in_ESI) {
    local_34 = in_ESI + 0xfffe7961;
    local_36 = 1;
  }
  startingAction = local_34;
  local_28 = in_R8;
  local_20 = in_R9;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  aVar2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffffe28);
  if ((aVar2 < startingAction) && ((local_36 & 1) == 0)) {
    local_1 = true;
  }
  else {
    local_48 = local_18;
    local_40 = uStack_10;
    local_58 = local_28;
    local_50 = local_20;
    header_00._M_str = in_stack_fffffffffffffe90;
    header_00._M_len = in_stack_fffffffffffffe88;
    message_00._M_str = in_stack_fffffffffffffe80;
    message_00._M_len = (size_t)in_stack_fffffffffffffe78;
    LogBuffer::push((LogBuffer *)in_stack_fffffffffffffe70,
                    (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),header_00,message_00);
    lvl = (level_enum)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    if ((local_35 & 1) == 0) {
      local_60 = &in_RDI->Tdemin;
      local_68._M_current =
           (pair<helics::GlobalFederateId,_int> *)
           CLI::std::
           vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ::begin((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_70 = (pair<helics::GlobalFederateId,_int> *)
                 CLI::std::
                 vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                 ::end((vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                          ((__normal_iterator<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                            *)in_stack_fffffffffffffe20,
                           (__normal_iterator<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        lvl = (level_enum)((ulong)in_stack_fffffffffffffe68 >> 0x20);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_78 = __gnu_cxx::
                   __normal_iterator<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
                   ::operator*(&local_68);
        if (((local_34 <= local_78->second) &&
            (bVar1 = GlobalFederateId::isValid(&local_78->first), bVar1)) &&
           (bVar1 = std::function::operator_cast_to_bool
                              ((function<void_(helics::ActionMessage_&&)> *)0x5bfcc7), bVar1)) {
          in_stack_fffffffffffffe30 = local_130;
          ActionMessage::ActionMessage(in_RDI,startingAction);
          local_120 = (local_78->first).gid;
          str._M_str = in_stack_fffffffffffffe50;
          str._M_len = (size_t)in_stack_fffffffffffffe48;
          ActionMessage::setString(in_RDI,startingAction,str);
          SmallBuffer::operator=
                    (in_stack_fffffffffffffe48,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_RDI);
          std::function<void_(helics::ActionMessage_&&)>::operator()
                    ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffe20,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
          ;
          ActionMessage::~ActionMessage(in_stack_fffffffffffffe20);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<helics::GlobalFederateId,_int>_*,_std::vector<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>_>
        ::operator++(&local_68);
      }
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)0x5bfdb6);
    if (bVar1) {
      if (((local_34 <= *(action_t *)((long)&(in_RDI->actionTime).internalTimeCode + 4)) ||
          (local_34 <= (action_t)(in_RDI->Te).internalTimeCode)) || ((local_36 & 1) != 0)) {
        __args_1._M_len._4_4_ = startingAction;
        __args_1._M_len._0_4_ = in_stack_fffffffffffffe38;
        __args_1._M_str = (char *)in_RDI;
        __args_2._M_str = in_stack_fffffffffffffe30;
        __args_2._M_len = (size_t)in_stack_fffffffffffffe28;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,__args_1,__args_2);
      }
    }
    else {
      bVar1 = std::atomic<bool>::load
                        ((atomic<bool> *)in_stack_fffffffffffffe28,
                         (memory_order)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      if (bVar1) {
        if ((local_34 <= *(action_t *)((long)&(in_RDI->actionTime).internalTimeCode + 4)) ||
           ((local_36 & 1) != 0)) {
          if (local_34 == (cmd_route_ack|cmd_disconnect_fed)) {
            CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5bfeaf);
            in_stack_fffffffffffffe78 = "{}";
            in_stack_fffffffffffffe80 = (char *)0x2;
            fmt.str.size_ = 2;
            fmt.str.data_ = "{}";
            spdlog::logger::log<std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffe70,lvl,fmt,in_stack_fffffffffffffe60);
          }
          else {
            in_stack_fffffffffffffe28 =
                 CLI::std::
                 __shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5bfef0);
            getSpdLogLevel(local_34);
            lvl = trace;
            in_stack_fffffffffffffe70 = (logger *)0x6;
            fmt_00.str.size_ = (size_t)in_stack_fffffffffffffe80;
            fmt_00.str.data_ = in_stack_fffffffffffffe78;
            spdlog::logger::
            log<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((logger *)0x6,trace,fmt_00,in_stack_fffffffffffffe60,
                       in_stack_fffffffffffffe58);
          }
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe28);
          if (bVar1) {
            CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5bff61);
            spdlog::logger::flush((logger *)0x5bff69);
          }
        }
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)((in_RDI->payload).buffer._M_elems + 0x18));
        if ((bVar1) &&
           ((local_34 <= (action_t)(in_RDI->Te).internalTimeCode || ((local_36 & 1) != 0)))) {
          if (local_34 == (cmd_route_ack|cmd_disconnect_fed)) {
            CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5bffb9);
            fmt_01.str.size_ = (size_t)in_stack_fffffffffffffe80;
            fmt_01.str.data_ = in_stack_fffffffffffffe78;
            spdlog::logger::log<std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffe70,lvl,fmt_01,
                       (basic_string_view<char,_std::char_traits<char>_> *)0x2);
          }
          else {
            CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5bfffa);
            getSpdLogLevel(local_34);
            fmt_02.str.size_ = (size_t)in_stack_fffffffffffffe80;
            fmt_02.str.data_ = in_stack_fffffffffffffe78;
            spdlog::logger::
            log<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                      (in_stack_fffffffffffffe70,lvl,fmt_02,in_stack_fffffffffffffe60,
                       in_stack_fffffffffffffe58);
          }
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffe28);
          if (bVar1) {
            CLI::std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x5c006b);
            spdlog::logger::flush((logger *)0x5c0073);
          }
        }
        return true;
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LogManager::sendToLogger(int logLevel,
                              std::string_view header,
                              std::string_view message,
                              bool fromRemote) const
{
    bool alwaysLog{fromRemote};
    if (logLevel > LogLevels::FED - 100) {
        logLevel -= static_cast<int>(LogLevels::FED);
        alwaysLog = true;
    }

    if (logLevel > maxLogLevel && !alwaysLog) {
        // check the logging level
        return true;
    }

    mLogBuffer.push(logLevel, header, message);
    if (!fromRemote) {
        for (const auto& rl : remoteTargets) {
            if (rl.second >= logLevel && rl.first.isValid()) {
                if (mTransmit) {
                    ActionMessage remMess(CMD_REMOTE_LOG);
                    remMess.dest_id = rl.first;
                    remMess.setString(0, header);
                    remMess.payload = message;
                    mTransmit(std::move(remMess));
                }
            }
        }
    }

    if (loggerFunction) {
        if (consoleLogLevel >= logLevel || fileLogLevel >= logLevel || alwaysLog) {
            loggerFunction(logLevel, header, message);
        }
    } else if (initialized.load()) {
        if (consoleLogLevel >= logLevel || alwaysLog) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                consoleLogger->log(spdlog::level::trace, "{}", message);
            } else {
                consoleLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                consoleLogger->flush();
            }
        }
        if (fileLogger && (fileLogLevel >= logLevel || alwaysLog)) {
            if (logLevel == HELICS_LOG_LEVEL_DUMPLOG) {  // dumplog
                fileLogger->log(spdlog::level::trace, "{}", message);
            } else {
                fileLogger->log(getSpdLogLevel(logLevel), "{}::{}", header, message);
            }

            if (forceLoggingFlush) {
                fileLogger->flush();
            }
        }
        return true;
    }
    return false;
}